

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O0

void __thiscall sjtu::OrderManager::~OrderManager(OrderManager *this)

{
  void *pvVar1;
  long in_RDI;
  pair<sjtu::orderType,_long> *tmp;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  
  local_18 = 0;
  local_10 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),&local_18);
  *(undefined4 *)(local_10 + 0xa0) = *(undefined4 *)(in_RDI + 4);
  local_20 = 0;
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(*(long **)(in_RDI + 0x10),&local_20);
  pvVar1 = *(void **)(in_RDI + 8);
  if (pvVar1 != (void *)0x0) {
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::~BplusTree(in_stack_ffffffffffffffc0);
    operator_delete(pvVar1,0x18);
  }
  if (*(long **)(in_RDI + 0x10) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x28))();
  }
  return;
}

Assistant:

~OrderManager() {
            auto tmp = OrderFile->read(0);
            tmp -> first.num = pending_id;
            OrderFile-> save(0);
            delete PendingBpTree;
            delete OrderFile;
        }